

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.c
# Opt level: O0

int aom_reader_init(aom_reader *r,uint8_t *buffer,size_t size)

{
  od_ec_dec *in_RDX;
  long in_RSI;
  long *in_RDI;
  uchar *in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((in_RDX == (od_ec_dec *)0x0) || (in_RSI != 0)) {
    in_RDI[1] = (long)&in_RDX->buf + in_RSI;
    *in_RDI = in_RSI;
    od_ec_dec_init(in_RDX,in_stack_ffffffffffffffd8,0);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int aom_reader_init(aom_reader *r, const uint8_t *buffer, size_t size) {
  if (size && !buffer) {
    return 1;
  }
  r->buffer_end = buffer + size;
  r->buffer = buffer;
  od_ec_dec_init(&r->ec, buffer, (uint32_t)size);
#if CONFIG_ACCOUNTING
  r->accounting = NULL;
#endif
  return 0;
}